

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_0::TestCase148::run(TestCase148 *this)

{
  bool bVar1;
  int16_t iVar2;
  ReaderFor<unsigned_int> RVar3;
  ConstSchema CVar4;
  float fVar5;
  StringPtr name;
  StringPtr displayName;
  StringPtr nestedName;
  StringPtr nestedName_00;
  StringPtr nestedName_01;
  StringPtr nestedName_02;
  StringPtr nestedName_03;
  StringPtr content;
  StringPtr diskPath;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  Fault f;
  ArrayPtr<const_char> local_150;
  ParsedSchema fileSchema;
  ReaderFor<capnp::DynamicStruct> structConst;
  ReaderFor<capnp::DynamicStruct> genericConst;
  SchemaParser parser;
  ReaderFor<capnp::DynamicList> list;
  FakeFileReader reader;
  
  FakeFileReader::FakeFileReader(&reader);
  SchemaParser::SchemaParser(&parser);
  SchemaParser::setDiskFilesystem(&parser,&reader.super_Filesystem);
  name.content.size_ = 0xc;
  name.content.ptr = "const.capnp";
  content.content.size_ = 0x131;
  content.content.ptr =
       "@0x8123456789abcdef;\nconst uint32Const :UInt32 = 1234;\nconst listConst :List(Float32) = [1.25, 2.5, 3e4];\nconst structConst :Foo = (bar = 123, baz = \"qux\");\nstruct Foo {\n  bar @0 :Int16;\n  baz @1 :Text;\n}\nconst genericConst :TestGeneric(Text) = (value = \"text\");\nstruct TestGeneric(T) {\n  value @0 :T;\n}\n"
  ;
  FakeFileReader::add(&reader,name,content);
  displayName.content.size_ = 0xc;
  displayName.content.ptr = "const.capnp";
  diskPath.content.size_ = 0xc;
  diskPath.content.ptr = "const.capnp";
  fileSchema = SchemaParser::parseDiskFile
                         (&parser,displayName,diskPath,(ArrayPtr<const_kj::StringPtr>)ZEXT816(0));
  nestedName.content.size_ = 0xc;
  nestedName.content.ptr = "uint32Const";
  _f = ParsedSchema::getNested(&fileSchema,nestedName);
  list.schema.elementType._0_8_ = Schema::asConst((Schema *)&f);
  RVar3 = ConstSchema::as<unsigned_int>((ConstSchema *)&list);
  if ((RVar3 != 0x4d2) && (kj::_::Debug::minSeverity < 3)) {
    structConst.schema.super_Schema.raw._0_4_ = 0x4d2;
    nestedName_00.content.size_ = 0xc;
    nestedName_00.content.ptr = "uint32Const";
    _f = ParsedSchema::getNested(&fileSchema,nestedName_00);
    list.schema.elementType._0_8_ = Schema::asConst((Schema *)&f);
    genericConst.schema.super_Schema.raw._0_4_ =
         (float)ConstSchema::as<unsigned_int>((ConstSchema *)&list);
    kj::_::Debug::log<char_const(&)[90],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xae,ERROR,
               "\"failed: expected \" \"(1234) == (fileSchema.getNested(\\\"uint32Const\\\").asConst().as<uint32_t>())\", 1234, fileSchema.getNested(\"uint32Const\").asConst().as<uint32_t>()"
               ,(char (*) [90])
                "failed: expected (1234) == (fileSchema.getNested(\"uint32Const\").asConst().as<uint32_t>())"
               ,(int *)&structConst,(uint *)&genericConst);
  }
  nestedName_01.content.size_ = 10;
  nestedName_01.content.ptr = "listConst";
  _f = ParsedSchema::getNested(&fileSchema,nestedName_01);
  structConst.schema.super_Schema.raw = (Schema)Schema::asConst((Schema *)&f);
  ConstSchema::as<capnp::DynamicList>(&list,(ConstSchema *)&structConst);
  if (list.reader.elementCount == 3) {
    DynamicList::Reader::operator[]((Reader *)&f,&list,0);
    fVar5 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (((fVar5 != 1.25) || (NAN(fVar5))) && (kj::_::Debug::minSeverity < 3)) {
      structConst.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x3ff4000000000000;
      DynamicList::Reader::operator[]((Reader *)&f,&list,0);
      fVar5 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
      genericConst.schema.super_Schema.raw._0_4_ = fVar5;
      kj::_::Debug::log<char_const(&)[49],double,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"(1.25) == (list[0].as<float>())\", 1.25, list[0].as<float>()"
                 ,(char (*) [49])"failed: expected (1.25) == (list[0].as<float>())",
                 (double *)&structConst,(float *)&genericConst);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    DynamicList::Reader::operator[]((Reader *)&f,&list,1);
    fVar5 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (((fVar5 != 2.5) || (NAN(fVar5))) && (kj::_::Debug::minSeverity < 3)) {
      structConst.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x4004000000000000;
      DynamicList::Reader::operator[]((Reader *)&f,&list,1);
      fVar5 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
      genericConst.schema.super_Schema.raw._0_4_ = fVar5;
      kj::_::Debug::log<char_const(&)[48],double,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb3,ERROR,
                 "\"failed: expected \" \"(2.5) == (list[1].as<float>())\", 2.5, list[1].as<float>()"
                 ,(char (*) [48])"failed: expected (2.5) == (list[1].as<float>())",
                 (double *)&structConst,(float *)&genericConst);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    DynamicList::Reader::operator[]((Reader *)&f,&list,2);
    fVar5 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (((fVar5 != 30000.0) || (NAN(fVar5))) && (kj::_::Debug::minSeverity < 3)) {
      structConst.schema.super_Schema.raw._0_4_ = 0x46ea6000;
      DynamicList::Reader::operator[]((Reader *)&f,&list,2);
      fVar5 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&f);
      genericConst.schema.super_Schema.raw._0_4_ = fVar5;
      kj::_::Debug::log<char_const(&)[49],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb4,ERROR,
                 "\"failed: expected \" \"(3e4f) == (list[2].as<float>())\", 3e4f, list[2].as<float>()"
                 ,(char (*) [49])"failed: expected (3e4f) == (list[2].as<float>())",
                 (float *)&structConst,(float *)&genericConst);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    nestedName_02.content.size_ = 0xc;
    nestedName_02.content.ptr = "structConst";
    _f = ParsedSchema::getNested(&fileSchema,nestedName_02);
    CVar4 = Schema::asConst((Schema *)&f);
    genericConst.schema.super_Schema.raw = CVar4.super_Schema.raw;
    ConstSchema::as<capnp::DynamicStruct>(&structConst,(ConstSchema *)&genericConst);
    name_00.content.size_ = 4;
    name_00.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)&f,&structConst,name_00);
    iVar2 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if ((iVar2 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
      genericConst.schema.super_Schema.raw._0_4_ = 1.7236e-43;
      name_01.content.size_ = 4;
      name_01.content.ptr = "bar";
      DynamicStruct::Reader::get((Reader *)&f,&structConst,name_01);
      local_150.ptr._0_2_ = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&f)
      ;
      kj::_::Debug::log<char_const(&)[65],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb7,ERROR,
                 "\"failed: expected \" \"(123) == (structConst.get(\\\"bar\\\").as<int16_t>())\", 123, structConst.get(\"bar\").as<int16_t>()"
                 ,(char (*) [65])
                  "failed: expected (123) == (structConst.get(\"bar\").as<int16_t>())",
                 (int *)&genericConst,(short *)&local_150);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    name_02.content.size_ = 4;
    name_02.content.ptr = "baz";
    DynamicStruct::Reader::get((Reader *)&f,&structConst,name_02);
    genericConst._0_16_ =
         DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    bVar1 = kj::operator==("qux",(StringPtr *)&genericConst);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      name_03.content.size_ = 4;
      name_03.content.ptr = "baz";
      DynamicStruct::Reader::get((Reader *)&f,&structConst,name_03);
      genericConst._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
      kj::_::Debug::log<char_const(&)[64],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb8,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (structConst.get(\\\"baz\\\").as<Text>())\", \"qux\", structConst.get(\"baz\").as<Text>()"
                 ,(char (*) [64])
                  "failed: expected (\"qux\") == (structConst.get(\"baz\").as<Text>())",
                 (char (*) [4])0x500e65,(Reader *)&genericConst);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    nestedName_03.content.size_ = 0xd;
    nestedName_03.content.ptr = "genericConst";
    _f = ParsedSchema::getNested(&fileSchema,nestedName_03);
    CVar4 = Schema::asConst((Schema *)&f);
    local_150.ptr = (char *)CVar4.super_Schema.raw;
    ConstSchema::as<capnp::DynamicStruct>(&genericConst,(ConstSchema *)&local_150);
    name_04.content.size_ = 6;
    name_04.content.ptr = "value";
    DynamicStruct::Reader::get((Reader *)&f,&genericConst,name_04);
    local_150 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
    bVar1 = kj::operator==("text",(StringPtr *)&local_150);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      name_05.content.size_ = 6;
      name_05.content.ptr = "value";
      DynamicStruct::Reader::get((Reader *)&f,&genericConst,name_05);
      local_150 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&f);
      kj::_::Debug::log<char_const(&)[68],char_const(&)[5],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xbb,ERROR,
                 "\"failed: expected \" \"(\\\"text\\\") == (genericConst.get(\\\"value\\\").as<Text>())\", \"text\", genericConst.get(\"value\").as<Text>()"
                 ,(char (*) [68])
                  "failed: expected (\"text\") == (genericConst.get(\"value\").as<Text>())",
                 (char (*) [5])0x4f2edc,(Reader *)&local_150);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    SchemaParser::~SchemaParser(&parser);
    FakeFileReader::~FakeFileReader(&reader);
    return;
  }
  structConst.schema.super_Schema.raw._0_4_ = 3;
  genericConst.schema.super_Schema.raw._0_4_ = (float)list.reader.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
             ,0xb1,FAILED,"(3u) == (list.size())","3u, list.size()",(uint *)&structConst,
             (uint *)&genericConst);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(SchemaParser, Constants) {
  // This is actually a test of the full dynamic API stack for constants, because the schemas for
  // constants are not actually accessible from the generated code API, so the only way to ever
  // get a ConstSchema is by parsing it.

  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("const.capnp",
      "@0x8123456789abcdef;\n"
      "const uint32Const :UInt32 = 1234;\n"
      "const listConst :List(Float32) = [1.25, 2.5, 3e4];\n"
      "const structConst :Foo = (bar = 123, baz = \"qux\");\n"
      "struct Foo {\n"
      "  bar @0 :Int16;\n"
      "  baz @1 :Text;\n"
      "}\n"
      "const genericConst :TestGeneric(Text) = (value = \"text\");\n"
      "struct TestGeneric(T) {\n"
      "  value @0 :T;\n"
      "}\n");

  ParsedSchema fileSchema = parser.parseDiskFile(
      "const.capnp", "const.capnp", nullptr);

  EXPECT_EQ(1234, fileSchema.getNested("uint32Const").asConst().as<uint32_t>());

  auto list = fileSchema.getNested("listConst").asConst().as<DynamicList>();
  ASSERT_EQ(3u, list.size());
  EXPECT_EQ(1.25, list[0].as<float>());
  EXPECT_EQ(2.5, list[1].as<float>());
  EXPECT_EQ(3e4f, list[2].as<float>());

  auto structConst = fileSchema.getNested("structConst").asConst().as<DynamicStruct>();
  EXPECT_EQ(123, structConst.get("bar").as<int16_t>());
  EXPECT_EQ("qux", structConst.get("baz").as<Text>());

  auto genericConst = fileSchema.getNested("genericConst").asConst().as<DynamicStruct>();
  EXPECT_EQ("text", genericConst.get("value").as<Text>());
}